

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O0

void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *p,int NodeId)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  abctime aVar4;
  Gia_Obj_t *pGVar5;
  abctime aVar6;
  bool bVar7;
  abctime clk;
  int Lit;
  int Id;
  int k;
  int i;
  Gia_Obj_t *pNode;
  int NodeId_local;
  Ssc_Man_t *p_local;
  
  if (NodeId < 1) {
    __assert_fail("NodeId > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscSat.c"
                  ,0xd5,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
  }
  iVar3 = Ssc_ObjSatVar(p,NodeId);
  if (iVar3 == 0) {
    aVar4 = Abc_Clock();
    Vec_IntClear(p->vFront);
    Ssc_ManCnfAddToFrontier(p,NodeId,p->vFront);
    Id = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vFront);
      bVar7 = false;
      if (Id < iVar3) {
        pGVar1 = p->pFraig;
        iVar3 = Vec_IntEntry(p->vFront,Id);
        _k = Gia_ManObj(pGVar1,iVar3);
        bVar7 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar3 = Gia_ObjId(p->pFraig,_k);
      iVar3 = Ssc_ObjSatVar(p,iVar3);
      if (iVar3 == 0) {
        __assert_fail("Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pNode))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscSat.c"
                      ,0xe1,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
      }
      iVar3 = Gia_ObjIsMuxType(_k);
      if (iVar3 == 0) {
        Ssc_ManCollectSuper(p->pFraig,_k,p->vFanins);
        for (Lit = 0; iVar3 = Vec_IntSize(p->vFanins), Lit < iVar3; Lit = Lit + 1) {
          iVar3 = Vec_IntEntry(p->vFanins,Lit);
          iVar3 = Abc_Lit2Var(iVar3);
          Ssc_ManCnfAddToFrontier(p,iVar3,p->vFront);
        }
        Gia_ManAddClausesSuper(p,_k,p->vFanins);
      }
      else {
        Vec_IntClear(p->vFanins);
        pVVar2 = p->vFanins;
        pGVar1 = p->pFraig;
        pGVar5 = Gia_ObjFanin0(_k);
        iVar3 = Gia_ObjFaninId0p(pGVar1,pGVar5);
        Vec_IntPushUnique(pVVar2,iVar3);
        pVVar2 = p->vFanins;
        pGVar1 = p->pFraig;
        pGVar5 = Gia_ObjFanin1(_k);
        iVar3 = Gia_ObjFaninId0p(pGVar1,pGVar5);
        Vec_IntPushUnique(pVVar2,iVar3);
        pVVar2 = p->vFanins;
        pGVar1 = p->pFraig;
        pGVar5 = Gia_ObjFanin0(_k);
        iVar3 = Gia_ObjFaninId1p(pGVar1,pGVar5);
        Vec_IntPushUnique(pVVar2,iVar3);
        pVVar2 = p->vFanins;
        pGVar1 = p->pFraig;
        pGVar5 = Gia_ObjFanin1(_k);
        iVar3 = Gia_ObjFaninId1p(pGVar1,pGVar5);
        Vec_IntPushUnique(pVVar2,iVar3);
        for (Lit = 0; iVar3 = Vec_IntSize(p->vFanins), Lit < iVar3; Lit = Lit + 1) {
          iVar3 = Vec_IntEntry(p->vFanins,Lit);
          Ssc_ManCnfAddToFrontier(p,iVar3,p->vFront);
        }
        Gia_ManAddClausesMux(p,_k);
      }
      iVar3 = Vec_IntSize(p->vFanins);
      if (iVar3 < 2) {
        __assert_fail("Vec_IntSize(p->vFanins) > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscSat.c"
                      ,0xf4,"void Ssc_ManCnfNodeAddToSolver(Ssc_Man_t *, int)");
      }
      Id = Id + 1;
    }
    aVar6 = Abc_Clock();
    p->timeCnfGen = (aVar6 - aVar4) + p->timeCnfGen;
  }
  return;
}

Assistant:

static void Ssc_ManCnfNodeAddToSolver( Ssc_Man_t * p, int NodeId )
{
    Gia_Obj_t * pNode;
    int i, k, Id, Lit;
    abctime clk;
    assert( NodeId > 0 );
    // quit if CNF is ready
    if ( Ssc_ObjSatVar(p, NodeId) )
        return;
clk = Abc_Clock();
    // start the frontier
    Vec_IntClear( p->vFront );
    Ssc_ManCnfAddToFrontier( p, NodeId, p->vFront );
    // explore nodes in the frontier
    Gia_ManForEachObjVec( p->vFront, p->pFraig, pNode, i )
    {
        // create the supergate
        assert( Ssc_ObjSatVar(p, Gia_ObjId(p->pFraig, pNode)) );
        if ( Gia_ObjIsMuxType(pNode) )
        {
            Vec_IntClear( p->vFanins );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId0p( p->pFraig, Gia_ObjFanin0(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId0p( p->pFraig, Gia_ObjFanin1(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId1p( p->pFraig, Gia_ObjFanin0(pNode) ) );
            Vec_IntPushUnique( p->vFanins, Gia_ObjFaninId1p( p->pFraig, Gia_ObjFanin1(pNode) ) );
            Vec_IntForEachEntry( p->vFanins, Id, k )
                Ssc_ManCnfAddToFrontier( p, Id, p->vFront );
            Gia_ManAddClausesMux( p, pNode );
        }
        else
        {
            Ssc_ManCollectSuper( p->pFraig, pNode, p->vFanins );
            Vec_IntForEachEntry( p->vFanins, Lit, k )
                Ssc_ManCnfAddToFrontier( p, Abc_Lit2Var(Lit), p->vFront );
            Gia_ManAddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_IntSize(p->vFanins) > 1 );
    }
p->timeCnfGen += Abc_Clock() - clk;
}